

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Specific.hh
# Opt level: O3

void avro::codec_traits<boost::array<unsigned_char,_16UL>_>::decode
               (Decoder *d,array<unsigned_char,_16UL> *s)

{
  undefined8 uVar1;
  value_type_conflict3 *__val;
  undefined8 *puVar2;
  
  puVar2 = (undefined8 *)operator_new(0x10);
  *puVar2 = 0;
  puVar2[1] = 0;
  (**(code **)(*(long *)d + 0x68))(d,0x10);
  uVar1 = puVar2[1];
  *(undefined8 *)s->elems = *puVar2;
  *(undefined8 *)(s->elems + 8) = uVar1;
  operator_delete(puVar2,0x10);
  return;
}

Assistant:

static void decode(Decoder& d, boost::array<uint8_t, N>& s) {
        std::vector<uint8_t> v(N);
        d.decodeFixed(N, v);
        std::copy(&v[0], &v[0] + N, &s[0]);
    }